

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_easy.cpp
# Opt level: O0

int256_t *
(anonymous_namespace)::
S2_easy_OpenMP<primesum::int256_t,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (uint128_t x,int64_t y,int64_t z,int64_t c,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *primes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *prime_sums,int threads)

{
  value_type vVar1;
  undefined1 a [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined8 uVar2;
  bool bVar3;
  size_type *psVar4;
  reference pvVar5;
  long *plVar6;
  int64_t iVar7;
  size_type __n;
  reference pvVar8;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int256_t *in_RDI;
  long in_R8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  int iStack0000000000000018;
  undefined1 in_stack_000000a0 [16];
  undefined1 in_stack_000000b0 [16];
  S2Status *in_stack_000000c8;
  int256_t phi;
  int64_t xn_1;
  int64_t l2;
  int64_t xm;
  int256_t phi_xn_sum;
  int64_t phi_xn;
  int64_t xn;
  int64_t pi_min_sparse;
  int64_t pi_min_clustered;
  int64_t l;
  int64_t min_hard;
  int64_t min_sparse;
  int64_t min_clustered;
  int64_t min_trivial;
  uint128_t x2;
  int64_t prime;
  int64_t b;
  S2Status status;
  int64_t pi_x13;
  int64_t pi_sqrty;
  PiTable pi;
  int64_t thread_threshold;
  int64_t x13;
  long in_stack_fffffffffffffc40;
  value_type in_stack_fffffffffffffc48;
  PiTable *in_stack_fffffffffffffc50;
  int64_t in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  S2Status *in_stack_fffffffffffffc68;
  int256_t *in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  undefined8 uVar12;
  uint64_t in_stack_fffffffffffffce8;
  int256_t *this;
  int256_t local_2b8;
  type_conflict3 *local_298;
  undefined1 local_288 [16];
  type_conflict3 *local_270;
  size_type local_220;
  type_conflict3 *local_218;
  undefined1 local_208 [16];
  type_conflict3 *local_1f0;
  int256_t local_1e8;
  long local_1c0;
  type_conflict3 *local_1b8;
  undefined8 local_1a8;
  undefined8 local_1a0;
  type_conflict3 *local_190;
  int64_t local_188;
  int64_t local_180;
  size_type local_178;
  long local_170;
  long local_168;
  long local_160;
  unsigned___int128 *local_158;
  undefined1 local_148 [16];
  unsigned___int128 *local_130;
  undefined1 local_128 [16];
  long local_110;
  undefined1 local_108 [16];
  ulong local_f8;
  size_type local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  int64_t local_b0;
  int64_t local_98 [5];
  undefined8 local_70;
  unsigned___int128 *local_68;
  undefined8 local_58;
  undefined8 local_50;
  unsigned___int128 *local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  this = in_RDI;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDX;
  primesum::int256_t::int256_t<int,void>(in_RDI,0);
  local_50 = local_20;
  local_58 = local_28;
  x_04._8_8_ = in_stack_fffffffffffffca8;
  x_04._0_8_ = in_stack_fffffffffffffca0;
  local_68 = primesum::iroot<3,unsigned__int128>((unsigned___int128)x_04);
  local_70 = 1000;
  local_48 = local_68;
  iStack0000000000000018 =
       primesum::ideal_num_threads
                 (in_stack_fffffffffffffc64,in_stack_fffffffffffffc58,
                  (int64_t)in_stack_fffffffffffffc50);
  primesum::PiTable::PiTable((PiTable *)this,in_stack_fffffffffffffce8);
  primesum::isqrt<long>(in_stack_fffffffffffffc40);
  local_98[0] = primesum::PiTable::operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_b0 = primesum::PiTable::operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_e0 = local_20;
  local_e8 = local_28;
  auVar9._8_8_ = in_stack_fffffffffffffc58;
  auVar9._0_8_ = in_stack_fffffffffffffc50;
  primesum::S2Status::S2Status(in_stack_fffffffffffffc68,(int128_t)auVar9);
  psVar4 = (size_type *)std::max<long>(&local_40,local_98);
  auVar11._8_8_ = in_stack_fffffffffffffc50;
  auVar11._0_8_ = in_stack_fffffffffffffc58;
  auVar10._8_8_ = in_stack_fffffffffffffc78;
  auVar10._0_8_ = in_stack_fffffffffffffc80;
  local_f0 = *psVar4;
  while (local_f0 = local_f0 + 1, (long)local_f0 <= local_b0) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_stack_00000008,local_f0);
    local_f8 = (ulong)*pvVar5;
    auVar9 = __udivti3(local_28,local_20,local_f8,0);
    local_108 = auVar9;
    auVar9 = __udivti3(auVar9._0_8_,auVar9._8_8_,local_f8,(long)local_f8 >> 0x3f);
    a._8_8_ = auVar11._0_8_;
    a._0_8_ = auVar11._8_8_;
    local_128 = auVar9;
    local_110 = primesum::min<unsigned__int128,long>((unsigned___int128)a,in_stack_fffffffffffffc48)
    ;
    x_03._4_4_ = in_stack_fffffffffffffc64;
    x_03._0_4_ = in_stack_fffffffffffffc60;
    x_03._8_8_ = in_stack_fffffffffffffc68;
    local_148 = local_108;
    local_158 = primesum::isqrt<unsigned__int128>((unsigned___int128)x_03);
    local_160 = local_38 / (long)local_f8;
    local_170 = local_30 / (long)local_f8;
    local_130 = local_158;
    plVar6 = std::max<long>(&local_170,(long *)&local_f8);
    local_168 = *plVar6;
    local_130 = (unsigned___int128 *)
                primesum::in_between<long,long,long>(local_168,(long)local_130,local_30);
    local_160 = primesum::in_between<long,long,long>(local_168,local_160,local_30);
    local_178 = primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
    local_180 = primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
    local_188 = primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
    while( true ) {
      uVar2 = local_108._0_8_;
      if ((long)local_178 <= local_180) break;
      uVar12 = local_108._8_8_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (in_stack_00000008,local_178);
      local_1a8 = uVar2;
      x_00._8_8_ = auVar11._0_8_;
      x_00._0_8_ = auVar11._8_8_;
      local_1a0 = uVar12;
      local_1b8 = primesum::fast_div<unsigned__int128,unsigned_int>
                            ((unsigned___int128)x_00,(uint)(in_stack_fffffffffffffc48 >> 0x20));
      local_190 = local_1b8;
      iVar7 = primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
      local_1c0 = (iVar7 - local_f0) + 2;
      __n = primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000010,__n);
      vVar1 = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000010,local_f0 - 1);
      primesum::int256_t::int256_t<unsigned_long,void>(&local_1e8,(vVar1 - *pvVar8) + 1);
      auVar10 = local_108;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (in_stack_00000008,(local_f0 - 1) + local_1c0);
      x_01._8_8_ = auVar11._0_8_;
      x_01._0_8_ = auVar11._8_8_;
      local_208 = auVar10;
      local_218 = primesum::fast_div<unsigned__int128,unsigned_int>
                            ((unsigned___int128)x_01,(uint)(in_stack_fffffffffffffc48 >> 0x20));
      local_1f0 = local_218;
      plVar6 = std::max<long>((long *)&local_1f0,(long *)&local_130);
      local_1f0 = (type_conflict3 *)*plVar6;
      local_220 = primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
      primesum::int256_t::operator*(auVar10._0_8_,auVar10._8_8_);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000010,local_178);
      in_stack_fffffffffffffc70 = (int256_t *)*pvVar8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (in_stack_00000010,local_220);
      primesum::int256_t::operator*(auVar10._0_8_,auVar10._8_8_);
      primesum::int256_t::operator+=
                (in_stack_fffffffffffffc70,(int256_t *)in_stack_fffffffffffffc68);
      local_178 = local_220;
    }
    for (; local_188 < (long)local_178; local_178 = local_178 - 1) {
      auVar11 = local_108;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (in_stack_00000008,local_178);
      x_02._8_8_ = auVar11._0_8_;
      x_02._0_8_ = auVar11._8_8_;
      local_288 = auVar11;
      local_298 = primesum::fast_div<unsigned__int128,unsigned_int>
                            ((unsigned___int128)x_02,(uint)(in_stack_fffffffffffffc48 >> 0x20));
      in_stack_fffffffffffffc60 = SUB84(in_stack_00000010,0);
      in_stack_fffffffffffffc64 = (int)((ulong)in_stack_00000010 >> 0x20);
      local_270 = local_298;
      in_stack_fffffffffffffc68 =
           (S2Status *)primesum::PiTable::operator[](auVar11._8_8_,in_stack_fffffffffffffc48);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          (size_type)in_stack_fffffffffffffc68);
      in_stack_fffffffffffffc48 = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000010,local_f0 - 1);
      primesum::int256_t::int256_t<unsigned_long,void>
                (&local_2b8,(in_stack_fffffffffffffc48 - *pvVar8) + 1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (in_stack_00000008,local_178);
      primesum::int256_t::operator*(auVar10._0_8_,auVar10._8_8_);
      primesum::int256_t::operator+=
                (in_stack_fffffffffffffc70,(int256_t *)in_stack_fffffffffffffc68);
    }
    bVar3 = primesum::is_print();
    if (bVar3) {
      primesum::S2Status::print
                (in_stack_000000c8,(int128_t)in_stack_000000b0,(int128_t)in_stack_000000a0);
    }
  }
  primesum::PiTable::~PiTable((PiTable *)0x14b41a);
  return in_RDI;
}

Assistant:

res_t S2_easy_OpenMP(uint128_t x,
                     int64_t y,
                     int64_t z,
                     int64_t c,
                     Primes& primes,
                     PrimeSums& prime_sums,
                     int threads)
{
  res_t s2_easy = 0;
  int64_t x13 = iroot<3>(x);
  int64_t thread_threshold = 1000;
  threads = ideal_num_threads(threads, x13, thread_threshold);
  using PS = typename PrimeSums::value_type;

  PiTable pi(y);
  int64_t pi_sqrty = pi[isqrt(y)];
  int64_t pi_x13 = pi[x13];
  S2Status status(x);

  #pragma omp parallel for schedule(dynamic) num_threads(threads) reduction(+: s2_easy)
  for (int64_t b = max(c, pi_sqrty) + 1; b <= pi_x13; b++)
  {
    int64_t prime = primes[b];
    uint128_t x2 = x / prime;
    int64_t min_trivial = min(x2 / prime, y);
    int64_t min_clustered = (int64_t) isqrt(x2);
    int64_t min_sparse = z / prime;
    int64_t min_hard = max(y / prime, prime);

    min_clustered = in_between(min_hard, min_clustered, y);
    min_sparse = in_between(min_hard, min_sparse, y);

    int64_t l = pi[min_trivial];
    int64_t pi_min_clustered = pi[min_clustered];
    int64_t pi_min_sparse = pi[min_sparse];

    // Find all clustered easy leaves:
    // n = primes[b] * primes[l]
    // x / n <= y && phi(x / n, b - 1) == phi(x / m, b - 1)
    // where phi(x / n, b - 1) = pi(x / n) - b + 2
    while (l > pi_min_clustered)
    {
      int64_t xn = (int64_t) fast_div(x2, primes[l]);
      int64_t phi_xn = pi[xn] - b + 2;
      res_t phi_xn_sum = prime_sums[pi[xn]] + 1 - prime_sums[b - 1];
      int64_t xm = (int64_t) fast_div(x2, primes[b + phi_xn - 1]);
      xm = max(xm, min_clustered);
      int64_t l2 = pi[xm];
      s2_easy += (phi_xn_sum * prime) * (prime_sums[l] - prime_sums[l2]);
      l = l2;
    }

    // Find all sparse easy leaves:
    // n = primes[b] * primes[l]
    // x / n <= y && phi(x / n, b - 1) = pi(x / n) - b + 2
    for (; l > pi_min_sparse; l--)
    {
      int64_t xn = (int64_t) fast_div(x2, primes[l]);
      res_t phi = prime_sums[pi[xn]] + 1 - prime_sums[b - 1];
      s2_easy += phi * ((PS) prime * primes[l]);
    }

    if (is_print())
      status.print(b, pi_x13);
  }

  return s2_easy;
}